

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O1

void __thiscall slang::ast::DeclaredType::resolveAt(DeclaredType *this,ASTContext *context)

{
  Scope *pSVar1;
  SourceLocation rhs;
  Expression *pEVar2;
  ASTContext *context_00;
  Type *this_00;
  SourceRange assignmentRange;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  
  if (this->type == (Type *)0x0) {
    getASTContext<false,slang::ast::ASTContext>((ASTContext *)&stack0xffffffffffffffa8,this);
    resolveType(this,(ASTContext *)&stack0xffffffffffffffa8,context);
    if (this->initializer != (Expression *)0x0) {
      return;
    }
  }
  if (this->initializerSyntax == (ExpressionSyntax *)0x0) {
    pEVar2 = (Expression *)0xffffffffffffffff;
  }
  else {
    pSVar1 = (context->scope).ptr;
    this_00 = this->type;
    if (this_00->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_00);
    }
    if (((this_00->canonical->super_Symbol).kind == EnumType) && (pSVar1->thisSym->kind == EnumType)
       ) {
      this_00 = this_00[1].canonical;
      context_00 = (ASTContext *)0x2;
    }
    else {
      context_00 = (ASTContext *)(ulong)((this->flags).m_bits >> 3 & 0x200);
    }
    rhs = this->initializerLocation;
    assignmentRange.startLoc =
         (SourceLocation)
         ((long)rhs * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U | (ulong)(rhs._0_4_ & 0xfffffff)
         );
    assignmentRange.endLoc = (SourceLocation)context;
    pEVar2 = Expression::bindRValue
                       ((Expression *)this_00,(Type *)this->initializerSyntax,
                        (ExpressionSyntax *)rhs,assignmentRange,context_00,in_stack_ffffffffffffffa8
                       );
  }
  this->initializer = pEVar2;
  return;
}

Assistant:

void DeclaredType::resolveAt(const ASTContext& context) const {
    if (!type) {
        resolveType(getASTContext<false>(), context);
        if (initializer)
            return;
    }

    if (!initializerSyntax) {
        initializer = NoInitializer;
        return;
    }

    // Enums are special in that their initializers target the base type of the enum
    // instead of the actual enum type (which doesn't allow implicit conversions from
    // normal integral values).
    auto& scope = *context.scope;
    bitmask<ASTFlags> extraFlags;
    const Type* targetType = type;
    if (targetType->isEnum() && scope.asSymbol().kind == SymbolKind::EnumType) {
        targetType = &targetType->as<EnumType>().baseType;
        extraFlags = ASTFlags::UnevaluatedBranch;
    }
    else if (flags.has(DeclaredTypeFlags::AllowUnboundedLiteral)) {
        extraFlags = ASTFlags::AllowUnboundedLiteral;
    }

    initializer = &Expression::bindRValue(*targetType, *initializerSyntax,
                                          {initializerLocation, initializerLocation + 1}, context,
                                          extraFlags);
}